

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainter.cpp
# Opt level: O0

void __thiscall QPainter::setOpacity(QPainter *this,qreal opacity)

{
  bool bVar1;
  QPainterPrivate *this_00;
  double *pdVar2;
  pointer pQVar3;
  long in_FS_OFFSET;
  double in_XMM0_Qa;
  QPainterPrivate *d;
  char *in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  int line;
  double dVar4;
  char *in_stack_ffffffffffffffa8;
  double local_40;
  double local_38;
  char local_30 [32];
  double local_10;
  long local_8;
  
  line = (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = in_XMM0_Qa;
  this_00 = d_func((QPainter *)0x59061b);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QPaintEngine,_QPainterPrivate::QPaintEngineDestructor> *)0x590631);
  if (bVar1) {
    local_38 = 1.0;
    local_40 = 0.0;
    pdVar2 = qMax<double>(&local_40,&local_10);
    pdVar2 = qMin<double>(&local_38,pdVar2);
    dVar4 = *pdVar2;
    local_10 = dVar4;
    pQVar3 = std::unique_ptr<QPainterState,_std::default_delete<QPainterState>_>::operator->
                       ((unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *)0x5906b7);
    if ((dVar4 != pQVar3->opacity) || (NAN(dVar4) || NAN(pQVar3->opacity))) {
      dVar4 = local_10;
      pQVar3 = std::unique_ptr<QPainterState,_std::default_delete<QPainterState>_>::operator->
                         ((unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *)0x5906e5
                         );
      pQVar3->opacity = dVar4;
      if (this_00->extended == (QPaintEngineEx *)0x0) {
        pQVar3 = std::unique_ptr<QPainterState,_std::default_delete<QPainterState>_>::operator->
                           ((unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *)
                            0x590727);
        QFlags<QPaintEngine::DirtyFlag>::operator|=
                  (&(pQVar3->super_QPaintEngineState).dirtyFlags,DirtyOpacity);
      }
      else {
        (*(this_00->extended->super_QPaintEngine)._vptr_QPaintEngine[0x24])();
      }
    }
  }
  else {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)this_00,in_stack_ffffffffffffffa8,line,in_stack_ffffffffffffff98);
    QMessageLogger::warning(local_30,"QPainter::setOpacity: Painter not active");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPainter::setOpacity(qreal opacity)
{
    Q_D(QPainter);

    if (!d->engine) {
        qWarning("QPainter::setOpacity: Painter not active");
        return;
    }

    opacity = qMin(qreal(1), qMax(qreal(0), opacity));

    if (opacity == d->state->opacity)
        return;

    d->state->opacity = opacity;

    if (d->extended)
        d->extended->opacityChanged();
    else
        d->state->dirtyFlags |= QPaintEngine::DirtyOpacity;
}